

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock.c
# Opt level: O3

void nn_sock_handler(nn_fsm *self,int src,int type,void *srcptr)

{
  code *UNRECOVERED_JUMPTABLE;
  nn_fsm_fn p_Var1;
  
  if (*(int *)&self[1].fn == 2) {
    if (src != 1) {
      if (src != -2) {
        if (type == 0x84c4) {
          p_Var1 = self[1].shutdown_fn;
          UNRECOVERED_JUMPTABLE = *(code **)(*(long *)p_Var1 + 0x28);
LAB_0012cff1:
          (*UNRECOVERED_JUMPTABLE)(p_Var1,srcptr);
          return;
        }
        if (type == 0x84c3) {
          p_Var1 = self[1].shutdown_fn;
          UNRECOVERED_JUMPTABLE = *(code **)(*(long *)p_Var1 + 0x20);
          goto LAB_0012cff1;
        }
        goto LAB_0012d016;
      }
      goto LAB_0012d008;
    }
    if (type == 1) {
      nn_list_erase((nn_list *)&self[3].owner,(nn_list_item *)((long)srcptr + 0x78));
      nn_ep_term((nn_ep *)srcptr);
      nn_free(srcptr);
      return;
    }
  }
  else {
    if (*(int *)&self[1].fn == 1) {
      if (src != -2) goto LAB_0012cffc;
      if (type == -2) {
        *(undefined4 *)&self[1].fn = 2;
        return;
      }
    }
    else {
      nn_sock_handler_cold_6();
LAB_0012cffc:
      nn_sock_handler_cold_4();
    }
    nn_sock_handler_cold_5();
LAB_0012d008:
    nn_sock_handler_cold_2();
  }
  nn_sock_handler_cold_1();
LAB_0012d016:
  nn_sock_handler_cold_3();
}

Assistant:

static void nn_sock_handler (struct nn_fsm *self, int src, int type,
    void *srcptr)
{
    struct nn_sock *sock;
    struct nn_ep *ep;

    sock = nn_cont (self, struct nn_sock, fsm);

    switch (sock->state) {

/******************************************************************************/
/*  INIT state.                                                               */
/******************************************************************************/
    case NN_SOCK_STATE_INIT:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_FSM_START:
                sock->state = NN_SOCK_STATE_ACTIVE;
                return;
            default:
                nn_fsm_bad_action (sock->state, src, type);
            }

        default:
            nn_fsm_bad_source (sock->state, src, type);
        }

/******************************************************************************/
/*  ACTIVE state.                                                             */
/******************************************************************************/
    case NN_SOCK_STATE_ACTIVE:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            default:
                nn_fsm_bad_action (sock->state, src, type);
            }

        case NN_SOCK_SRC_EP:
            switch (type) {
            case NN_EP_STOPPED:

                /*  This happens when an endpoint is closed using
                    nn_shutdown() function. */
                ep = (struct nn_ep*) srcptr;
                nn_list_erase (&sock->sdeps, &ep->item);
                nn_ep_term (ep);
                nn_free (ep);
                return;

            default:
                nn_fsm_bad_action (sock->state, src, type);
            }

        default:

            /*  The assumption is that all the other events come from pipes. */
            switch (type) {
            case NN_PIPE_IN:
                sock->sockbase->vfptr->in (sock->sockbase,
                    (struct nn_pipe*) srcptr);
                return;
            case NN_PIPE_OUT:
                sock->sockbase->vfptr->out (sock->sockbase,
                    (struct nn_pipe*) srcptr);
                return;
            default:
                nn_fsm_bad_action (sock->state, src, type);
            }
        }

/******************************************************************************/
/*  Invalid state.                                                            */
/******************************************************************************/
    default:
        nn_fsm_bad_state (sock->state, src, type);
    }
}